

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluCallLogWrapper.cpp
# Opt level: O3

ostream * __thiscall eglu::operator<<(eglu *this,ostream *str,PointerFmt<void_*> fmt)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (str == (ostream *)0x0) {
    pcVar2 = "(null)";
    lVar1 = 6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"{ ",2);
    if ((uint)fmt.arr != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
        }
        std::ostream::_M_insert<void_const*>(this);
        uVar3 = uVar3 + 1;
      } while ((uint)fmt.arr != uVar3);
    }
    pcVar2 = " }";
    lVar1 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar2,lVar1);
  return (ostream *)this;
}

Assistant:

std::ostream& operator<< (std::ostream& str, PointerFmt<T> fmt)
{
	if (fmt.arr != DE_NULL)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			str << fmt.arr[ndx];
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}